

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O3

int create_iso_image(uchar *buff,size_t buffsize,size_t *used,char *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  archive *paVar4;
  ulong uVar5;
  ulong __n;
  long lVar6;
  char sym1 [2];
  char fname2 [256];
  char fname1 [256];
  char sym128 [129];
  char sym255 [256];
  char local_3d6 [2];
  int local_3d4;
  archive *local_3d0;
  char local_3c8;
  undefined4 uStack_3c7;
  undefined1 auStack_3c3 [251];
  char local_2c8;
  undefined4 uStack_2c7;
  undefined1 auStack_2c3 [251];
  char local_1c8 [144];
  char local_138 [254];
  undefined2 local_3a;
  
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Û',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_iso9660(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ü',(uint)(iVar2 == 0),"0 == archive_write_set_format_iso9660(a)",paVar4);
  iVar2 = archive_write_add_filter_none(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ý',(uint)(iVar2 == 0),"0 == archive_write_add_filter_none(a)",paVar4);
  iVar2 = archive_write_set_option(paVar4,(char *)0x0,"pad",(char *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Þ',(uint)(iVar2 == 0),"0 == archive_write_set_option(a, NULL, \"pad\", NULL)"
                   ,paVar4);
  if (used != (size_t *)0x0) {
    iVar2 = archive_write_set_options(paVar4,(char *)used);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'à',(uint)(iVar2 == 0),"0 == archive_write_set_options(a, opt)",paVar4);
  }
  iVar2 = archive_write_set_bytes_per_block(paVar4,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'á',(uint)(iVar2 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",paVar4);
  iVar2 = archive_write_set_bytes_in_last_block(paVar4,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'â',(uint)(iVar2 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",
                   paVar4);
  iVar2 = archive_write_open_memory(paVar4,buff,0x3c000,(size_t *)buffsize);
  local_3d0 = paVar4;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'ã',(uint)(iVar2 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, used)",paVar4);
  local_3d6[0] = 'x';
  local_3d6[1] = '\0';
  builtin_strncpy(local_1c8,
                  "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaax"
                  ,0x81);
  memset(local_138,0x61,0xfe);
  local_3a = 0x78;
  lVar6 = 0;
  iVar2 = 0;
  do {
    uVar1 = *(uint *)((long)&DAT_0025e7d0 + lVar6);
    __n = (ulong)(int)uVar1;
    if ((long)__n < 1) {
      __n = 0;
LAB_001c81a7:
      paVar4 = local_3d0;
      (&local_2c8)[__n] = '.';
      uVar5 = __n & 0xffffffff;
      *(undefined2 *)(auStack_2c3 + (uVar5 - 4)) = 99;
      (&local_3c8)[__n] = '.';
      *(undefined2 *)(auStack_3c3 + (uVar5 - 4)) = 0x43;
      local_3d4 = iVar2;
      add_entry(local_3d0,&local_2c8,local_1c8);
      add_entry(paVar4,&local_3c8,local_138);
      if ((uint)__n < 0xfc) {
        (&local_2c8)[__n] = '.';
        *(undefined4 *)(auStack_2c3 + (uVar5 - 4)) = 0x676e70;
        (&local_3c8)[__n] = '.';
        *(undefined4 *)(auStack_3c3 + (uVar5 - 4)) = 0x474e50;
        add_entry(paVar4,&local_2c8,(char *)0x0);
        add_entry(paVar4,&local_3c8,local_3d6);
        if (uVar5 == 0xfb) {
          iVar2 = local_3d4 + 4;
        }
        else {
          (&local_2c8)[__n] = '.';
          *(undefined4 *)(auStack_2c3 + (uVar5 - 4)) = 0x6765706a;
          auStack_2c3[uVar5] = 0;
          (&local_3c8)[__n] = '.';
          *(undefined4 *)(auStack_3c3 + (uVar5 - 4)) = 0x4745504a;
          auStack_3c3[uVar5] = 0;
          add_entry(paVar4,&local_2c8,local_1c8);
          add_entry(paVar4,&local_3c8,local_138);
          iVar2 = local_3d4 + 6;
        }
      }
      else {
        iVar2 = local_3d4 + 2;
      }
    }
    else {
      memset(&local_2c8,0x61,__n);
      memset(&local_3c8,0x41,__n);
      paVar4 = local_3d0;
      (&local_2c8)[__n] = '\0';
      (&local_3c8)[__n] = '\0';
      add_entry(local_3d0,&local_2c8,(char *)0x0);
      add_entry(paVar4,&local_3c8,local_3d6);
      iVar2 = iVar2 + 2;
      if (uVar1 < 0xfe) goto LAB_001c81a7;
    }
    paVar4 = local_3d0;
    lVar6 = lVar6 + 4;
    if (lVar6 == 0x80) {
      iVar3 = archive_write_close(local_3d0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'ī',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar4);
      iVar3 = archive_write_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",paVar4);
      return iVar2;
    }
  } while( true );
}

Assistant:

static int
create_iso_image(unsigned char *buff, size_t buffsize, size_t *used,
    const char *opt)
{
	struct archive *a;
	int i, l, fcnt;
	const int lens[] = {
	    0, 1, 3, 5, 7, 8, 9, 29, 30, 31, 32,
		62, 63, 64, 65, 101, 102, 103, 104,
	    191, 192, 193, 194, 204, 205, 206, 207, 208,
		252, 253, 254, 255,
	    -1 };
	char fname1[256];
	char fname2[256];
	char sym1[2];
	char sym128[129];
	char sym255[256];

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_iso9660(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_option(a, NULL, "pad", NULL));
	if (opt)
		assertA(0 == archive_write_set_options(a, opt));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, used));

	sym1[0] = 'x';
	sym1[1] = '\0';
	for (i = 0; i < (int)sizeof(sym128)-2; i++)
		sym128[i] = 'a';
	sym128[sizeof(sym128)-2] = 'x';
	sym128[sizeof(sym128)-1] = '\0';
	for (i = 0; i < (int)sizeof(sym255)-2; i++)
		sym255[i] = 'a';
	sym255[sizeof(sym255)-2] = 'x';
	sym255[sizeof(sym255)-1] = '\0';

	fcnt = 0;
	for (i = 0; lens[i] >= 0; i++) {
		for (l = 0; l < lens[i]; l++) {
			fname1[l] = 'a';
			fname2[l] = 'A';
		}
		if (l > 0) {
			fname1[l] = '\0';
			fname2[l] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 254) {
			fname1[l] = '.';
			fname1[l+1] = 'c';
			fname1[l+2] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'C';
			fname2[l+2] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
		if (l < 252) {
			fname1[l] = '.';
			fname1[l+1] = 'p';
			fname1[l+2] = 'n';
			fname1[l+3] = 'g';
			fname1[l+4] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'P';
			fname2[l+2] = 'N';
			fname2[l+3] = 'G';
			fname2[l+4] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 251) {
			fname1[l] = '.';
			fname1[l+1] = 'j';
			fname1[l+2] = 'p';
			fname1[l+3] = 'e';
			fname1[l+4] = 'g';
			fname1[l+5] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'J';
			fname2[l+2] = 'P';
			fname2[l+3] = 'E';
			fname2[l+4] = 'G';
			fname2[l+5] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
	}

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	return (fcnt);
}